

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPTP.cpp
# Opt level: O1

TermList __thiscall Parse::TPTP::createTypeConApplication(TPTP *this,string *name,uint arity)

{
  pointer pcVar1;
  TermList msg_1;
  TermList TVar2;
  TermList TVar3;
  Exception *pEVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  TermList *pTVar9;
  bool added;
  bool local_69;
  TPTP *local_68;
  uint local_5c;
  ulong local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar7 = (ulong)arity;
  local_69 = false;
  local_68 = this;
  local_5c = Kernel::Signature::addTypeCon(DAT_00b7e1b0,name,arity,&local_69);
  local_58 = uVar7;
  if (local_69 == true) {
    pEVar4 = (Exception *)__cxa_allocate_exception(0x50);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pcVar1 = (name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + name->_M_string_length);
    ::Lib::Exception::Exception<char_const*,std::__cxx11::string,char_const*,unsigned_int>
              (pEVar4,"Undeclared type constructor ",&local_50,"/",(uint)local_58);
    pEVar4->_vptr_Exception = (_func_int **)&PTR_cry_00b6a028;
    *(undefined4 *)&pEVar4[1]._vptr_Exception = 0;
    pEVar4[1]._message._M_dataplus._M_p = (pointer)&pEVar4[1]._message.field_2;
    pEVar4[1]._message._M_string_length = 0;
    pEVar4[1]._message.field_2._M_local_buf[0] = '\0';
    __cxa_throw(pEVar4,&::Lib::UserErrorException::typeinfo,
                ::Lib::UserErrorException::~UserErrorException);
  }
  if (arity == 0) {
    pTVar9 = (TermList *)0x0;
  }
  else {
    pTVar9 = (local_68->_termLists)._stack;
    pTVar9 = pTVar9 + (((ulong)((long)(local_68->_termLists)._cursor - (long)pTVar9) >> 3) -
                      (ulong)arity);
  }
  if (arity != 0) {
    uVar6 = (ulong)(arity != 0);
    uVar7 = uVar6 << 0x20;
    uVar8 = uVar6;
    do {
      TVar3._content = pTVar9[uVar8 >> 0x20]._content;
      msg_1 = sortOf(local_68,TVar3);
      TVar2 = Kernel::AtomicSort::superSort();
      if (msg_1._content != TVar2._content) {
        pEVar4 = (Exception *)__cxa_allocate_exception(0x50);
        ::Lib::Exception::
        Exception<char_const*,Kernel::TermList,char_const*,Kernel::TermList,char_const*>
                  (pEVar4,"The sort ",msg_1," of type argument ",TVar3,
                   " is not $tType as mandated by TF1");
        pEVar4->_vptr_Exception = (_func_int **)&PTR_cry_00b6a028;
        *(undefined4 *)&pEVar4[1]._vptr_Exception = 0;
        pEVar4[1]._message._M_dataplus._M_p = (pointer)&pEVar4[1]._message.field_2;
        pEVar4[1]._message._M_string_length = 0;
        pEVar4[1]._message.field_2._M_local_buf[0] = '\0';
        __cxa_throw(pEVar4,&::Lib::UserErrorException::typeinfo,
                    ::Lib::UserErrorException::~UserErrorException);
      }
      uVar5 = (uint)uVar6;
      arity = (uint)local_58;
      if (uVar5 < arity) {
        uVar8 = uVar7;
      }
      uVar7 = uVar7 + 0x100000000;
      uVar6 = (ulong)(uVar5 + 1);
    } while (uVar5 < arity);
  }
  TVar3._content = (uint64_t)Kernel::AtomicSort::create(local_5c,arity,pTVar9);
  if (arity != 0) {
    (local_68->_termLists)._cursor = (local_68->_termLists)._cursor + (-1 - (ulong)(arity - 1));
  }
  return (TermList)TVar3._content;
}

Assistant:

TermList TPTP::createTypeConApplication(std::string name, unsigned arity)
{ 
  ASS_GE(_termLists.size(), arity);

  bool added = false;
  unsigned typeCon = env.signature->addTypeCon(name,arity,added);
  if(added)
    USER_ERROR("Undeclared type constructor ", name, "/", arity);

  auto args = nLastTermLists(arity);
  for (auto i : range(0, arity)) {
    auto term = args[i];
    auto sort = sortOf(term);
    if (sort != AtomicSort::superSort()) 
        USER_ERROR("The sort ", sort, " of type argument ", term, " is not $tType as mandated by TF1");
  }
  auto s = TermList(AtomicSort::create(typeCon, arity, args));
  _termLists.pop(arity);
  return s;
}